

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O3

bool rcg::setString(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,
                   bool exception)

{
  int iVar1;
  element_type *peVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  uint *puVar7;
  long *plVar8;
  undefined8 uVar9;
  invalid_argument *piVar10;
  long *plVar11;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  longlong lVar15;
  size_type *psVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  float fVar20;
  string elem;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  stringstream in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  long *local_200;
  pointer local_1f8;
  long local_1f0;
  undefined5 local_1e8;
  undefined3 uStack_1e3;
  undefined5 uStack_1e0;
  undefined1 uStack_1db;
  undefined2 uStack_1da;
  string local_1d8 [4];
  ios_base local_158 [264];
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined2 local_38;
  undefined1 local_36;
  
  uVar17 = (uint)exception;
  peVar2 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)local_1d8,name);
  iVar5 = (*(peVar2->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar2,local_1d8);
  puVar7 = (uint *)CONCAT44(extraout_var,iVar5);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_1d8);
  if (puVar7 == (uint *)0x0) {
    if (!exception) {
      return false;
    }
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Feature not found: ","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_1d8[0]._M_dataplus._M_p = (pointer)*plVar11;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_1d8[0]._M_dataplus._M_p == psVar16) {
      local_1d8[0].field_2._0_8_ = *psVar16;
      local_1d8[0].field_2._8_8_ = plVar11[3];
      local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
    }
    else {
      local_1d8[0].field_2._0_8_ = *psVar16;
    }
    local_1d8[0]._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::invalid_argument::invalid_argument(piVar10,(string *)local_1d8);
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar5 = (*(code *)**(undefined8 **)((long)puVar7 + *(long *)(*(long *)puVar7 + -0x28)))
                    ((long)puVar7 + *(long *)(*(long *)puVar7 + -0x28));
  if ((iVar5 != 4) && (iVar5 != 2)) {
    if (!exception) {
      return false;
    }
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"Feature not writable: ","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_1d8[0]._M_dataplus._M_p = (pointer)*plVar11;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_1d8[0]._M_dataplus._M_p == psVar16) {
      local_1d8[0].field_2._0_8_ = *psVar16;
      local_1d8[0].field_2._8_8_ = plVar11[3];
      local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
    }
    else {
      local_1d8[0].field_2._0_8_ = *psVar16;
    }
    local_1d8[0]._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::invalid_argument::invalid_argument(piVar10,(string *)local_1d8);
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar6 = (**(code **)(*(long *)puVar7 + 0xf0))(puVar7);
  switch(uVar6) {
  case 2:
    plVar11 = (long *)__dynamic_cast(puVar7,&GenApi_3_4::INode::typeinfo,
                                     &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
    iVar5 = (**(code **)(*plVar11 + 0x88))(plVar11);
    if (iVar5 != 4) {
      if (iVar5 == 5) {
        std::__cxx11::string::string((string *)&local_248,value,(allocator *)&local_228);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)local_1d8,(string *)&local_248,_S_out|_S_in);
        local_200 = plVar11;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        local_248._M_string_length = 0;
        local_248.field_2._M_allocated_capacity =
             local_248.field_2._M_allocated_capacity & 0xffffffffffffff00;
        iVar5 = 4;
        uVar18 = 0;
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        do {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1d8,(string *)&local_248,'.');
          _Var3._M_p = local_248._M_dataplus._M_p;
          piVar13 = __errno_location();
          iVar1 = *piVar13;
          *piVar13 = 0;
          uVar14 = strtol(_Var3._M_p,(char **)&local_228,10);
          if (local_228._M_dataplus._M_p == _Var3._M_p) goto LAB_00126af4;
          if ((uVar14 - 0x80000000 < 0xffffffff00000000) || (*piVar13 == 0x22)) goto LAB_00126b00;
          if (*piVar13 == 0) {
            *piVar13 = iVar1;
          }
          uVar18 = uVar14 & 0xff | uVar18 << 8;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        (**(code **)(*local_200 + 0x38))(local_200,uVar18,1);
      }
      else {
        if (iVar5 != 6) {
          std::__cxx11::string::string((string *)local_1d8,value,(allocator *)&local_248);
          lVar15 = std::__cxx11::stoll(local_1d8,(size_t *)0x0,10);
          (**(code **)(*plVar11 + 0x38))(plVar11,lVar15,1);
          break;
        }
        std::__cxx11::string::string((string *)&local_248,value,(allocator *)&local_228);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)local_1d8,(string *)&local_248,_S_out|_S_in);
        local_200 = plVar11;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        local_248._M_string_length = 0;
        local_248.field_2._M_allocated_capacity =
             local_248.field_2._M_allocated_capacity & 0xffffffffffffff00;
        iVar5 = 4;
        uVar18 = 0;
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        do {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1d8,(string *)&local_248,':');
          _Var3._M_p = local_248._M_dataplus._M_p;
          piVar13 = __errno_location();
          iVar1 = *piVar13;
          *piVar13 = 0;
          uVar14 = strtol(_Var3._M_p,(char **)&local_228,0x10);
          if (local_228._M_dataplus._M_p == _Var3._M_p) goto LAB_00126b0c;
          if ((uVar14 - 0x80000000 < 0xffffffff00000000) || (*piVar13 == 0x22)) goto LAB_00126b18;
          if (*piVar13 == 0) {
            *piVar13 = iVar1;
          }
          uVar18 = uVar14 & 0xff | uVar18 << 8;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        (**(code **)(*local_200 + 0x38))(local_200,uVar18,1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
      std::ios_base::~ios_base(local_158);
      return false;
    }
    std::__cxx11::string::string((string *)local_1d8,value,(allocator *)&local_248);
    lVar15 = std::__cxx11::stoll(local_1d8,(size_t *)0x0,0x10);
    (**(code **)(*plVar11 + 0x38))(plVar11,lVar15,1);
    break;
  case 3:
    plVar11 = (long *)__dynamic_cast(puVar7,&GenApi_3_4::INode::typeinfo,
                                     &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
    std::__cxx11::string::string((string *)local_1d8,value,(allocator *)&local_248);
    iVar5 = std::__cxx11::string::compare((char *)local_1d8);
    bVar19 = true;
    if (((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)local_1d8), iVar5 != 0)) &&
       (iVar5 = std::__cxx11::string::compare((char *)local_1d8), iVar5 != 0)) {
      iVar5 = std::__cxx11::string::compare((char *)local_1d8);
      if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)local_1d8), iVar5 == 0))
         || (iVar5 = std::__cxx11::string::compare((char *)local_1d8), iVar5 == 0)) {
        bVar19 = false;
      }
      else {
        iVar5 = std::__cxx11::stoi(local_1d8,(size_t *)0x0,10);
        bVar19 = iVar5 != 0;
      }
    }
    (**(code **)(*plVar11 + 0x38))(plVar11,bVar19,1);
    break;
  default:
    if (!exception) {
      return false;
    }
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"Feature of unknown datatype: ","");
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_1d8[0]._M_dataplus._M_p = (pointer)*plVar11;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_1d8[0]._M_dataplus._M_p == psVar16) {
      local_1d8[0].field_2._0_8_ = *psVar16;
      local_1d8[0].field_2._8_8_ = plVar11[3];
      local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
    }
    else {
      local_1d8[0].field_2._0_8_ = *psVar16;
    }
    local_1d8[0]._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::invalid_argument::invalid_argument(piVar10,(string *)local_1d8);
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case 5:
    plVar11 = (long *)__dynamic_cast(puVar7,&GenApi_3_4::INode::typeinfo,
                                     &GenApi_3_4::IFloat::typeinfo,0xfffffffffffffffe);
    std::__cxx11::string::string((string *)local_1d8,value,(allocator *)&local_228);
    _Var3._M_p = local_1d8[0]._M_dataplus._M_p;
    puVar7 = (uint *)__errno_location();
    uVar17 = *puVar7;
    *puVar7 = 0;
    value = (char *)&local_248;
    fVar20 = strtof(_Var3._M_p,(char **)value);
    if (local_248._M_dataplus._M_p != _Var3._M_p) {
      if (*puVar7 == 0) {
        *puVar7 = uVar17;
      }
      else if (*puVar7 == 0x22) {
        std::__throw_out_of_range("stof");
        goto switchD_0012620d_caseD_9;
      }
      (**(code **)(*plVar11 + 0x38))(SUB84((double)fVar20,0),plVar11,1);
      break;
    }
    goto LAB_00126b24;
  case 6:
    plVar11 = (long *)__dynamic_cast(puVar7,&GenApi_3_4::INode::typeinfo,
                                     &GenApi_3_4::IString::typeinfo,0xfffffffffffffffe);
    GenICam_3_4::gcstring::gcstring((gcstring *)local_1d8,value);
    (**(code **)(*plVar11 + 0x38))(plVar11,local_1d8,1);
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_1d8);
    return false;
  case 7:
    plVar11 = (long *)__dynamic_cast(puVar7,&GenApi_3_4::INode::typeinfo,
                                     &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
    std::__cxx11::string::string((string *)local_1d8,value,(allocator *)&local_248);
    lVar12 = std::__cxx11::string::find_first_not_of((char *)local_1d8,0x138eec,0);
    if (lVar12 == -1) {
      local_228._M_dataplus._M_p = (pointer)0x0;
      local_228._M_string_length = 0;
      local_228.field_2._M_allocated_capacity = 0;
      if (local_1d8[0]._M_string_length != 1) {
        uVar18 = 0;
        local_200 = plVar11;
        do {
          std::__cxx11::string::substr((ulong)&local_248,(ulong)local_1d8);
          _Var3._M_p = local_248._M_dataplus._M_p;
          piVar13 = __errno_location();
          iVar5 = *piVar13;
          *piVar13 = 0;
          lVar12 = strtol(_Var3._M_p,(char **)&local_1f8,0x10);
          if (local_1f8 == (pointer)_Var3._M_p) {
            std::__throw_invalid_argument("stoi");
LAB_00126ae8:
            std::__throw_out_of_range("stoi");
            goto LAB_00126af4;
          }
          if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar13 == 0x22)) goto LAB_00126ae8;
          if (*piVar13 == 0) {
            *piVar13 = iVar5;
          }
          local_50 = (undefined8 *)CONCAT71(local_50._1_7_,(uchar)lVar12);
          if (local_228._M_string_length == local_228.field_2._M_allocated_capacity) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_228,
                       (iterator)local_228._M_string_length,(uchar *)&local_50);
          }
          else {
            *(uchar *)local_228._M_string_length = (uchar)lVar12;
            local_228._M_string_length = local_228._M_string_length + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p);
          }
          uVar18 = uVar18 + 2;
          plVar11 = local_200;
        } while (uVar18 < local_1d8[0]._M_string_length - 1);
      }
      sVar4 = local_228._M_string_length;
      _Var3._M_p = local_228._M_dataplus._M_p;
      uVar14 = (**(code **)(*plVar11 + 0x48))(plVar11,0);
      uVar18 = sVar4 - (long)_Var3._M_p;
      if (uVar14 < uVar18) {
        uVar18 = uVar14;
      }
      (**(code **)(*plVar11 + 0x38))(plVar11,_Var3._M_p,uVar18,1);
      if (local_228._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      break;
    }
    goto LAB_00126b30;
  case 9:
switchD_0012620d_caseD_9:
    plVar11 = (long *)__dynamic_cast(puVar7,&GenApi_3_4::INode::typeinfo,
                                     &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
    GenICam_3_4::gcstring::gcstring((gcstring *)local_1d8,value);
    plVar8 = (long *)(**(code **)(*plVar11 + 0x68))(plVar11,local_1d8);
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_1d8);
    if (plVar8 != (long *)0x0) {
      uVar9 = (**(code **)(*plVar8 + 0x38))(plVar8);
      (**(code **)(*plVar11 + 0x50))(plVar11,uVar9,1);
      return false;
    }
    if ((char)uVar17 == '\0') {
      return false;
    }
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_1f8 = (pointer)&local_1e8;
    local_1e8 = 0x656d756e45;
    uStack_1e3 = 0x746172;
    uStack_1e0 = 0x27206e6f69;
    local_1f0 = 0xd;
    uStack_1db = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_1f8);
    local_228._M_dataplus._M_p = (pointer)*plVar11;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_228._M_dataplus._M_p == psVar16) {
      local_228.field_2._M_allocated_capacity = *psVar16;
      local_228.field_2._8_8_ = plVar11[3];
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar16;
    }
    local_228._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_228);
    local_248._M_dataplus._M_p = (pointer)*plVar11;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_248._M_dataplus._M_p == psVar16) {
      local_248.field_2._M_allocated_capacity = *psVar16;
      local_248.field_2._8_8_ = plVar11[3];
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar16;
    }
    local_248._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_1d8[0]._M_dataplus._M_p = (pointer)*plVar11;
    psVar16 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_1d8[0]._M_dataplus._M_p == psVar16) {
      local_1d8[0].field_2._0_8_ = *psVar16;
      local_1d8[0].field_2._8_8_ = plVar11[3];
      local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
    }
    else {
      local_1d8[0].field_2._0_8_ = *psVar16;
    }
    local_1d8[0]._M_string_length = plVar11[1];
    *plVar11 = (long)psVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::invalid_argument::invalid_argument(piVar10,(string *)local_1d8);
    __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
    operator_delete(local_1d8[0]._M_dataplus._M_p);
  }
  return false;
LAB_00126af4:
  std::__throw_invalid_argument("stoi");
LAB_00126b00:
  std::__throw_out_of_range("stoi");
LAB_00126b0c:
  std::__throw_invalid_argument("stoi");
LAB_00126b18:
  std::__throw_out_of_range("stoi");
LAB_00126b24:
  std::__throw_invalid_argument("stof");
LAB_00126b30:
  piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_50 = &local_40;
  local_40 = 0x7265747369676552;
  local_38 = 0x2720;
  local_48 = 10;
  local_36 = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_1f8 = (pointer)*plVar11;
  plVar8 = plVar11 + 2;
  if ((long *)local_1f8 == plVar8) {
    lVar12 = plVar11[3];
    local_1e8 = (undefined5)*plVar8;
    uStack_1e3 = (undefined3)((ulong)*plVar8 >> 0x28);
    uStack_1e0 = (undefined5)lVar12;
    uStack_1db = (undefined1)((ulong)lVar12 >> 0x28);
    uStack_1da = (undefined2)((ulong)lVar12 >> 0x30);
    local_1f8 = (pointer)&local_1e8;
  }
  else {
    local_1e8 = (undefined5)*plVar8;
    uStack_1e3 = (undefined3)((ulong)*plVar8 >> 0x28);
  }
  local_1f0 = plVar11[1];
  *plVar11 = (long)plVar8;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_228._M_dataplus._M_p = (pointer)*plVar11;
  psVar16 = (size_type *)(plVar11 + 2);
  if ((size_type *)local_228._M_dataplus._M_p == psVar16) {
    local_228.field_2._M_allocated_capacity = *psVar16;
    local_228.field_2._8_8_ = plVar11[3];
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar16;
  }
  local_228._M_string_length = plVar11[1];
  *plVar11 = (long)psVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::operator+(&local_248,&local_228,local_1d8);
  std::invalid_argument::invalid_argument(piVar10,(string *)&local_248);
  __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool setString(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
               const char *value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        switch (node->GetPrincipalInterfaceType())
        {
          case GenApi::intfIBoolean:
            {
              GenApi::IBoolean *p=dynamic_cast<GenApi::IBoolean *>(node);

              std::string v=std::string(value);
              if (v == "true" || v == "True" || v == "TRUE")
              {
                p->SetValue(1);
              }
              else if (v == "false" || v == "False" || v == "FALSE")
              {
                p->SetValue(0);
              }
              else
              {
                p->SetValue(static_cast<bool>(std::stoi(v)));
              }
            }
            break;

          case GenApi::intfIInteger:
            {
              GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(node);

              switch (p->GetRepresentation())
              {
                case GenApi::HexNumber:
                  p->SetValue(std::stoll(std::string(value), 0, 16));
                  break;

                case GenApi::IPV4Address:
                  {
                    int64_t ip=0;

                    std::stringstream in(value);
                    std::string elem;

                    for (int i=0; i<4; i++)
                    {
                      getline(in, elem, '.');
                      ip=(ip<<8)|(stoi(elem)&0xff);
                    }

                    p->SetValue(ip);
                  }
                  break;

                case GenApi::MACAddress:
                  {
                    int64_t mac=0;

                    std::stringstream in(value);
                    std::string elem;

                    for (int i=0; i<4; i++)
                    {
                      getline(in, elem, ':');
                      mac=(mac<<8)|(stoi(elem, 0, 16)&0xff);
                    }

                    p->SetValue(mac);
                  }
                  break;

                default:
                  p->SetValue(std::stoll(std::string(value)));
                  break;
              }
            }
            break;

          case GenApi::intfIFloat:
            {
              GenApi::IFloat *p=dynamic_cast<GenApi::IFloat *>(node);
              p->SetValue(std::stof(std::string(value)));
            }
            break;

          case GenApi::intfIEnumeration:
            {
              GenApi::IEnumeration *p=dynamic_cast<GenApi::IEnumeration *>(node);
              GenApi::IEnumEntry *entry=0;

              try
              {
                entry=p->GetEntryByName(value);
              }
              catch (const GENICAM_NAMESPACE::GenericException &)
              { }

              if (entry != 0)
              {
                p->SetIntValue(entry->GetValue());
              }
              else if (exception)
              {
                throw std::invalid_argument(std::string("Enumeration '")+name+
                                            "' does not contain: "+value);
              }
            }
            break;

          case GenApi::intfIRegister:
            {
              GenApi::IRegister *p=dynamic_cast<GenApi::IRegister *>(node);

              std::string s=value;

              size_t n=s.find_first_not_of("0123456789abcdefABCDEF");
              if (n != std::string::npos)
              {
                throw std::invalid_argument(std::string("Register '")+name+
                  "only accepts hedadecimal values: "+s);
              }

              std::vector<uint8_t> buffer;
              for (size_t i=0; i<s.size()-1; i+=2)
              {
                buffer.push_back(stoi(s.substr(i, 2), 0, 16));
              }

              p->Set(buffer.data(), std::min(buffer.size(), static_cast<size_t>(p->GetLength())));
            }
            break;

          case GenApi::intfIString:
            {
              GenApi::IString *p=dynamic_cast<GenApi::IString *>(node);
              p->SetValue(value);
            }
            break;

          default:
            if (exception)
            {
              throw std::invalid_argument(std::string("Feature of unknown datatype: ")+name);
            }
            break;
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}